

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall cppcms::json::value::at(value *this,char *cpath,value *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value vVar2;
  _Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
  *this_00;
  iterator iVar3;
  bad_value_cast *this_01;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  variant *pvVar7;
  ulong uVar8;
  ulong uVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_bool>
  pVar10;
  string_key path;
  value local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
  local_e8;
  undefined8 local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  long local_a0;
  char local_98 [16];
  string local_88;
  key_type local_68;
  value *local_38;
  
  local_38 = v;
  local_b0 = cpath + -1;
  do {
    pcVar5 = local_b0 + 1;
    local_b0 = local_b0 + 1;
  } while (*pcVar5 != '\0');
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = '\0';
  paVar1 = &local_68.key_.field_2;
  uVar9 = 0;
  local_b8 = cpath;
  do {
    pcVar5 = local_b8;
    local_68.end_ = local_b0;
    if (local_b8 == (char *)0x0) {
      pcVar5 = local_a8;
      local_68.end_ = local_a8 + local_a0;
    }
    uVar6 = (long)local_68.end_ - (long)pcVar5;
    if (uVar9 < uVar6) {
      local_68.begin_ = pcVar5 + uVar9;
      uVar8 = uVar9;
      do {
        if (pcVar5[uVar8] == '.') break;
        uVar8 = uVar8 + 1;
      } while (uVar8 <= uVar6);
      if (uVar6 <= uVar8) {
        uVar8 = 0xffffffffffffffff;
      }
      if (uVar8 - uVar9 <= (ulong)((long)local_68.end_ - (long)local_68.begin_)) {
        local_68.end_ = pcVar5 + uVar8;
      }
    }
    else {
      local_68.begin_ = (char *)0x0;
      local_68.end_ = (char *)0x0;
      uVar8 = 0xffffffffffffffff;
    }
    local_68.key_._M_string_length = 0;
    local_68.key_.field_2._M_local_buf[0] = '\0';
    local_68.key_._M_dataplus._M_p = (pointer)paVar1;
    if ((local_68.begin_ == (char *)0x0) || (local_68.end_ == local_68.begin_)) {
      this_01 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      local_e8.first._M_dataplus._M_p = (pointer)&local_e8.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Invalid path provided","");
      bad_value_cast::bad_value_cast(this_01,&local_e8.first);
      __cxa_throw(this_01,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    pvVar7 = *(variant **)this;
    if (pvVar7->type != is_object) {
      local_e8.first.field_2._M_allocated_capacity = 0;
      local_e8.first._M_dataplus._M_p = (pointer)0x0;
      local_e8.first._M_string_length = 0;
      local_e8.first.field_2._8_8_ = &local_e8.first._M_string_length;
      local_c0 = 0;
      local_e8.second.d.d.ptr_ = (copyable)(copyable)local_e8.first.field_2._8_8_;
      value<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                ((value *)&local_88,
                 (map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                  *)&local_e8);
      pvVar7 = *(variant **)this;
      *this = (value)local_88._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)pvVar7;
      if (pvVar7 != (variant *)0x0) {
        variant::destroy(pvVar7);
        operator_delete(pvVar7);
      }
      std::
      _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
      ::~_Rb_tree((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                   *)&local_e8);
      pvVar7 = *(variant **)this;
    }
    this_00 = (_Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
               *)variant::
                 get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                           (pvVar7);
    iVar3 = std::
            _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::find((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                    *)this_00,&local_68);
    if (iVar3._M_node == (_Base_ptr)(this_00 + 8)) {
      string_key::str_abi_cxx11_(&local_88,&local_68);
      local_f0.d.d.ptr_ = (copyable)operator_new(0x38);
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x20) = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x28) = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x10) = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x18) = 0;
      *(undefined8 *)local_f0.d.d.ptr_ = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 8) = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x30) = 0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value,_true>
                (&local_e8,&local_88,&local_f0);
      pVar10 = std::
               _Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
               ::_M_emplace_unique<std::pair<std::__cxx11::string,cppcms::json::value>>
                         (this_00,&local_e8);
      vVar2.d.d.ptr_ = local_e8.second.d.d.ptr_;
      iVar3._M_node = (_Base_ptr)pVar10.first._M_node;
      if (local_e8.second.d.d.ptr_ != (copy_ptr<cppcms::json::value::_data>)0x0) {
        variant::destroy((variant *)local_e8.second.d.d.ptr_);
        operator_delete((void *)vVar2.d.d.ptr_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
        operator_delete(local_e8.first._M_dataplus._M_p);
      }
      vVar2.d.d.ptr_ = local_f0.d.d.ptr_;
      if (local_f0.d.d.ptr_ != (copy_ptr<cppcms::json::value::_data>)0x0) {
        variant::destroy((variant *)local_f0.d.d.ptr_);
        operator_delete((void *)vVar2.d.d.ptr_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.key_._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.key_._M_dataplus._M_p);
    }
    this = (value *)&iVar3._M_node[2]._M_left;
    pcVar4 = local_b8;
    pcVar5 = local_b0;
    if (local_b8 == (char *)0x0) {
      pcVar4 = local_a8;
      pcVar5 = local_a8 + local_a0;
    }
    if ((uVar8 == 0xffffffffffffffff) ||
       (uVar9 = uVar8 + 1, (ulong)((long)pcVar5 - (long)pcVar4) <= uVar9)) {
      if (this != local_38) {
        booster::copy_ptr<cppcms::json::value::_data>::operator=
                  ((copy_ptr<cppcms::json::value::_data> *)this,
                   (copy_ptr<cppcms::json::value::_data> *)local_38);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      return;
    }
  } while( true );
}

Assistant:

void value::at(char const *cpath,value const &v)
	{
		string_key path=string_key::unowned(cpath);
		value *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key part=path.unowned_substr(pos,new_pos - pos);


			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				throw bad_value_cast("Invalid path provided");
			if(ptr->type()!=json::is_object) {
				*ptr=json::object();
			}
			json::object &obj=ptr->object();
			json::object::iterator p;
			if((p=obj.find(part))==obj.end()) {
				ptr=&obj.insert(std::make_pair(part.str(),json::value())).first->second;
			}
			else
				ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		*ptr=v;
	}